

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O0

void idx2::InsertionSort<idx2::sub_channel_info*>(sub_channel_info *Beg,sub_channel_info *End)

{
  sub_channel *psVar1;
  i8 iVar2;
  undefined6 uVar3;
  i8 iVar4;
  i8 iVar5;
  undefined6 uVar6;
  sub_channel_info *psVar7;
  sub_channel_info *psVar8;
  sub_channel_info *local_50;
  sub_channel_info *It;
  sub_channel_info *Pos;
  sub_channel_info *Last;
  sub_channel_info *End_local;
  sub_channel_info *Beg_local;
  sub_channel_info T;
  
  if (Beg != End) {
    for (Pos = Beg + 1; Pos != End; Pos = Pos + 1) {
      psVar7 = BinarySearch<idx2::sub_channel_info,idx2::sub_channel_info*>(Beg,Pos,Pos);
      for (local_50 = Pos; local_50 != psVar7; local_50 = local_50 + -1) {
        psVar8 = local_50 + -1;
        iVar4 = local_50->Level;
        iVar5 = local_50->Subband;
        uVar6 = *(undefined6 *)&local_50->field_0x2;
        psVar1 = local_50->SubChannel;
        iVar2 = psVar8->Subband;
        uVar3 = *(undefined6 *)&psVar8->field_0x2;
        local_50->Level = psVar8->Level;
        local_50->Subband = iVar2;
        *(undefined6 *)&local_50->field_0x2 = uVar3;
        local_50->SubChannel = local_50[-1].SubChannel;
        psVar8->Level = iVar4;
        psVar8->Subband = iVar5;
        *(undefined6 *)&psVar8->field_0x2 = uVar6;
        local_50[-1].SubChannel = psVar1;
      }
    }
  }
  return;
}

Assistant:

void
InsertionSort(i Beg, i End)
{
  if (Beg == End)
    return;
  i Last = Beg + 1;
  while (Last != End)
  {
    i Pos = BinarySearch(Beg, Last, *Last);
    for (i It = Last; It != Pos; --It)
      Swap(It, It - 1);
    ++Last;
  }
}